

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  byte *pbVar1;
  ImGuiDockNode **ppIVar2;
  byte bVar3;
  uint uVar4;
  ImGuiDockContext *this;
  ImGuiDockContext *pIVar5;
  ImGuiDockRequest *pIVar6;
  char *pcVar7;
  ImGuiContext *ctx;
  ushort uVar8;
  ImGuiDockNode *pIVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  int n_1;
  ulong uVar15;
  int n_2;
  int n;
  long lVar16;
  byte bVar17;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  ImGuiDockNode *local_50;
  ImGuiDockNode *node;
  
  ctx = GImGui;
  this = GImGui->DockContext;
  if (root_id == 0) {
    uVar8 = 0;
    local_50 = (ImGuiDockNode *)0x0;
    uVar10 = 0;
  }
  else {
    local_50 = DockContextFindNodeByID(GImGui,root_id);
    if (local_50 == (ImGuiDockNode *)0x0) {
      return;
    }
    uVar8 = *(ushort *)&local_50->field_0xb0 & 7;
    uVar10 = *(ushort *)&local_50->field_0xb0 & 0x38;
  }
  nodes_to_remove.Size = 0;
  nodes_to_remove.Capacity = 0;
  nodes_to_remove.Data = (ImGuiDockNode **)0x0;
  bVar17 = 0;
  for (lVar16 = 0; lVar16 < (this->Nodes).Data.Size; lVar16 = lVar16 + 1) {
    pIVar9 = (ImGuiDockNode *)(this->Nodes).Data.Data;
    node = pIVar9->ChildNodes[lVar16 * 2 + -2];
    if ((node != (ImGuiDockNode *)0x0) &&
       ((root_id == 0 ||
        ((node->ID != root_id && (pIVar9 = DockNodeGetRootNode(pIVar9), pIVar9->ID == root_id))))))
    {
      bVar3 = *(byte *)((long)&node->LocalFlags + 1);
      if (root_id != 0) {
        pIVar5 = ctx->DockContext;
        uVar4 = (pIVar5->Requests).Size;
        uVar11 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar11 = 0;
        }
        for (lVar12 = 0; uVar11 * 0x40 != lVar12; lVar12 = lVar12 + 0x40) {
          pIVar6 = (pIVar5->Requests).Data;
          if (*(ImGuiDockNode **)((long)&pIVar6->DockTargetNode + lVar12) == node) {
            *(undefined4 *)((long)&pIVar6->Type + lVar12) = 0;
          }
        }
        if (root_id != 0) {
          DockNodeMoveWindows(local_50,node);
        }
      }
      ImVector<ImGuiDockNode_*>::push_back(&nodes_to_remove,&node);
      bVar17 = bVar17 | (bVar3 & 8) >> 3;
    }
  }
  if (root_id != 0) {
    *(ushort *)&local_50->field_0xb0 =
         uVar10 | uVar8 | (ushort)*(undefined4 *)&local_50->field_0xb0 & 0xffc0;
  }
  pcVar7 = (ctx->SettingsWindows).Buf.Data;
  uVar11 = 0;
  if (0 < nodes_to_remove.Size) {
    uVar11 = nodes_to_remove._0_8_ & 0xffffffff;
  }
  pcVar13 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    pcVar13 = pcVar7 + 4;
  }
  do {
    if (pcVar13 == (char *)0x0) {
      if (1 < nodes_to_remove.Size) {
        qsort(nodes_to_remove.Data,nodes_to_remove._0_8_ & 0xffffffff,8,
              DockNodeComparerDepthMostFirst);
      }
      for (lVar16 = 0; lVar16 < nodes_to_remove.Size; lVar16 = lVar16 + 1) {
        DockContextRemoveNode(ctx,nodes_to_remove.Data[lVar16],false);
      }
      if (root_id == 0) {
        ImVector<ImGuiStorage::ImGuiStoragePair>::clear
                  ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this);
        ImVector<ImGuiDockRequest>::clear(&this->Requests);
      }
      else if (bVar17 != 0) {
        pbVar1 = (byte *)((long)&local_50->LocalFlags + 1);
        *pbVar1 = *pbVar1 | 8;
        local_50->CentralNode = local_50;
      }
      ImVector<ImGuiDockNode_*>::~ImVector(&nodes_to_remove);
      return;
    }
    if (*(ImGuiID *)(pcVar13 + 0x14) != 0) {
      uVar15 = 0;
      do {
        if (uVar11 == uVar15) goto LAB_00155c9a;
        ppIVar2 = nodes_to_remove.Data + uVar15;
        uVar15 = uVar15 + 1;
      } while ((*ppIVar2)->ID != *(ImGuiID *)(pcVar13 + 0x14));
      *(ImGuiID *)(pcVar13 + 0x14) = root_id;
    }
LAB_00155c9a:
    pcVar14 = pcVar13 + *(int *)(pcVar13 + -4);
    pcVar13 = (char *)0x0;
    if (pcVar14 != pcVar7 + 4 + (ctx->SettingsWindows).Buf.Size) {
      pcVar13 = pcVar14;
    }
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc = ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}